

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O3

Matrix33 * __thiscall AML::Matrix33::operator/=(Matrix33 *this,double rhs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar5 = *(undefined1 (*) [16])((long)&this->field_0 + 0x10);
  auVar1 = *(undefined1 (*) [16])((long)&this->field_0 + 0x20);
  auVar2 = *(undefined1 (*) [16])((long)&this->field_0 + 0x30);
  auVar4._8_8_ = rhs;
  auVar4._0_8_ = rhs;
  auVar4 = divpd(*(undefined1 (*) [16])&this->field_0,auVar4);
  *(undefined1 (*) [16])&this->field_0 = auVar4;
  auVar3._8_8_ = rhs;
  auVar3._0_8_ = rhs;
  auVar5 = divpd(auVar5,auVar3);
  *(undefined1 (*) [16])((long)&this->field_0 + 0x10) = auVar5;
  auVar5._8_8_ = rhs;
  auVar5._0_8_ = rhs;
  auVar5 = divpd(auVar1,auVar5);
  *(undefined1 (*) [16])((long)&this->field_0 + 0x20) = auVar5;
  auVar1._8_8_ = rhs;
  auVar1._0_8_ = rhs;
  auVar5 = divpd(auVar2,auVar1);
  *(undefined1 (*) [16])((long)&this->field_0 + 0x30) = auVar5;
  (this->field_0).data[2][2] = (this->field_0).data[2][2] / rhs;
  return this;
}

Assistant:

Matrix33& Matrix33::operator/=(double rhs)
    {
        m11 /= rhs;
        m12 /= rhs;
        m13 /= rhs;
        m21 /= rhs;
        m22 /= rhs;
        m23 /= rhs;
        m31 /= rhs;
        m32 /= rhs;
        m33 /= rhs;
        return *this;
    }